

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O0

void daccontrol_refresh_data(void *info,UINT8 *Data,UINT32 DataLen)

{
  dac_control *chip;
  UINT32 DataLen_local;
  UINT8 *Data_local;
  void *info_local;
  
  if ((*(byte *)((long)info + 0x7c) & 0x80) == 0) {
    if ((DataLen == 0) || (Data == (UINT8 *)0x0)) {
      *(undefined4 *)((long)info + 0x60) = 0;
      *(undefined8 *)((long)info + 0x68) = 0;
    }
    else {
      *(UINT32 *)((long)info + 0x60) = DataLen;
      *(UINT8 **)((long)info + 0x68) = Data;
    }
  }
  return;
}

Assistant:

void daccontrol_refresh_data(void* info, UINT8* Data, UINT32 DataLen)
{
	// should be called to fix the data pointer (e.g. after a realloc)
	dac_control* chip = (dac_control*)info;
	
	if (chip->Running & 0x80)
		return;
	
	if (DataLen && Data != NULL)
	{
		chip->DataLen = DataLen;
		chip->Data = Data;
	}
	else
	{
		chip->DataLen = 0x00;
		chip->Data = NULL;
	}
	
	return;
}